

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_utils.c
# Opt level: O2

int Reset(WebPWorker *worker)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  WebPWorkerStatus WVar2;
  
  worker->had_error = 0;
  WVar2 = worker->status;
  if (WVar2 != OK) {
    if (WVar2 != NOT_OK) {
      iVar1 = Sync(worker);
      return iVar1;
    }
    __mutex = (pthread_mutex_t *)WebPSafeCalloc(1,0x60);
    worker->impl = __mutex;
    if (__mutex == (pthread_mutex_t *)0x0) {
      WVar2 = NOT_OK;
    }
    else {
      WVar2 = NOT_OK;
      iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      if (iVar1 == 0) {
        iVar1 = pthread_cond_init((pthread_cond_t *)(__mutex + 1),(pthread_condattr_t *)0x0);
        if (iVar1 == 0) {
          pthread_mutex_lock(__mutex);
          iVar1 = pthread_create((pthread_t *)((long)__mutex + 0x58),(pthread_attr_t *)0x0,
                                 ThreadLoop,worker);
          if (iVar1 == 0) {
            worker->status = OK;
            pthread_mutex_unlock(__mutex);
            return 1;
          }
          pthread_mutex_unlock(__mutex);
          pthread_mutex_destroy(__mutex);
          pthread_cond_destroy((pthread_cond_t *)(__mutex + 1));
        }
        else {
          pthread_mutex_destroy(__mutex);
        }
      }
      WebPSafeFree(__mutex);
      worker->impl = (void *)0x0;
    }
  }
  return WVar2;
}

Assistant:

static int Reset(WebPWorker* const worker) {
  int ok = 1;
  worker->had_error = 0;
  if (worker->status < OK) {
#ifdef WEBP_USE_THREAD
    WebPWorkerImpl* const impl =
        (WebPWorkerImpl*)WebPSafeCalloc(1, sizeof(WebPWorkerImpl));
    worker->impl = (void*)impl;
    if (worker->impl == NULL) {
      return 0;
    }
    if (pthread_mutex_init(&impl->mutex, NULL)) {
      goto Error;
    }
    if (pthread_cond_init(&impl->condition, NULL)) {
      pthread_mutex_destroy(&impl->mutex);
      goto Error;
    }
    pthread_mutex_lock(&impl->mutex);
    ok = !pthread_create(&impl->thread, NULL, ThreadLoop, worker);
    if (ok) worker->status = OK;
    pthread_mutex_unlock(&impl->mutex);
    if (!ok) {
      pthread_mutex_destroy(&impl->mutex);
      pthread_cond_destroy(&impl->condition);
 Error:
      WebPSafeFree(impl);
      worker->impl = NULL;
      return 0;
    }
#else
    worker->status = OK;
#endif
  } else if (worker->status > OK) {
    ok = Sync(worker);
  }
  assert(!ok || (worker->status == OK));
  return ok;
}